

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# analyzer.cpp
# Opt level: O2

void __thiscall
SQCompilation::CheckerVisitor::checkUnwantedModification(CheckerVisitor *this,CallExpr *call)

{
  TreeOp TVar1;
  pointer pSVar2;
  bool bVar3;
  TerExpr *ter;
  SQChar *n;
  Expr *pEVar4;
  long lStack_20;
  
  if (this->effectsOnly == false) {
    n = extractFunctionName(this,call);
    if (n == (SQChar *)0x0) {
      return;
    }
    bVar3 = nameLooksLikeModifiesObject(n);
    if (!bVar3) {
      return;
    }
    if (3 < (call->_callee->super_Node)._op - TO_GETFIELD) {
      return;
    }
    pSVar2 = (this->nodeStack).
             super__Vector_base<SQCompilation::CheckerVisitor::StackSlot,_std::allocator<SQCompilation::CheckerVisitor::StackSlot>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    if ((pSVar2[-1].sst == SST_NODE) && ((pSVar2[-1].field_1.n)->_op == TO_NEWSLOT)) {
      return;
    }
    pEVar4 = deparen((Expr *)call->_callee[1].super_Node.super_ArenaObj._vptr_ArenaObj);
    TVar1 = (pEVar4->super_Node)._op;
    if (TVar1 == TO_NULLC) {
      lStack_20 = 0x28;
    }
    else {
      if (TVar1 != TO_TERNARY) {
        return;
      }
      if (*(int *)(*(long *)&pEVar4[1].super_Node._coordinates + 0x18) - 0x3dU < 2)
      goto LAB_00146853;
      lStack_20 = 0x30;
    }
    if (*(int *)(*(long *)((long)&(pEVar4->super_Node).super_ArenaObj._vptr_ArenaObj + lStack_20) +
                0x18) - 0x3dU < 2) {
LAB_00146853:
      report(this,(Node *)call,0x77,n);
      return;
    }
  }
  return;
}

Assistant:

void CheckerVisitor::checkUnwantedModification(const CallExpr *call) {
  if (effectsOnly)
    return;

  const SQChar *name = extractFunctionName(call);

  if (!name)
    return;

  if (!nameLooksLikeModifiesObject(name))
    return;

  const Expr *callee = call->callee();

  if (!callee->isAccessExpr())
    return;

  if (nodeStack.back().sst == SST_NODE) {
    const Node *p = nodeStack.back().n;
    if (p->op() == TO_NEWSLOT)
      return;
  }

  if (isIndeterminated(callee->asAccessExpr()->receiver()))
    report(call, DiagnosticsId::DI_UNWANTED_MODIFICATION, name);
}